

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O1

void __thiscall Assimp::ObjFileImporter::~ObjFileImporter(ObjFileImporter *this)

{
  Object *this_00;
  pointer pcVar1;
  pointer pcVar2;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00899280;
  this_00 = this->m_pRootObject;
  if (this_00 != (Object *)0x0) {
    ObjFile::Object::~Object(this_00);
    operator_delete(this_00);
  }
  this->m_pRootObject = (Object *)0x0;
  pcVar1 = (this->m_strAbsPath)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_strAbsPath).field_2) {
    operator_delete(pcVar1);
  }
  pcVar2 = (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2);
  }
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

ObjFileImporter::~ObjFileImporter() {
    delete m_pRootObject;
    m_pRootObject = nullptr;
}